

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O0

histprune_t *
histprune_init(int32 maxhmm,int32 maxhist,int32 maxword,int32 hmmhistbinsize,int32 numNodes)

{
  histprune_t *phVar1;
  int32 *piVar2;
  int32 n;
  histprune_t *h;
  int32 numNodes_local;
  int32 hmmhistbinsize_local;
  int32 maxword_local;
  int32 maxhist_local;
  int32 maxhmm_local;
  
  phVar1 = (histprune_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                          ,0x145);
  phVar1->maxwpf = maxword;
  phVar1->maxhmmpf = maxhmm;
  phVar1->maxhistpf = maxhist;
  phVar1->hmm_hist_binsize = hmmhistbinsize;
  phVar1->hmm_hist_bins = numNodes / phVar1->hmm_hist_binsize + 1;
  piVar2 = (int32 *)__ckd_calloc__((long)phVar1->hmm_hist_bins,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                                   ,0x150);
  phVar1->hmm_hist = piVar2;
  return phVar1;
}

Assistant:

histprune_t *
histprune_init(int32 maxhmm, int32 maxhist, int32 maxword,
               int32 hmmhistbinsize, int32 numNodes)
{
    histprune_t *h;
    int32 n;

    h = (histprune_t *) ckd_calloc(1, sizeof(histprune_t));
    h->maxwpf = maxword;
    h->maxhmmpf = maxhmm;
    h->maxhistpf = maxhist;
    h->hmm_hist_binsize = hmmhistbinsize;

    n = numNodes;
    n /= h->hmm_hist_binsize;

    h->hmm_hist_bins = n + 1;

    h->hmm_hist = (int32 *) ckd_calloc(h->hmm_hist_bins, sizeof(int32));


    return h;
}